

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinePath.cpp
# Opt level: O1

void __thiscall chrono::geometry::ChLinePath::EraseSubLine(ChLinePath *this,size_t n)

{
  pointer *ppdVar1;
  pointer __src;
  pointer pdVar2;
  pointer pdVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  double dVar7;
  
  std::
  vector<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
  ::_M_erase(&this->lines,
             (this->lines).
             super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
             ._M_impl.super__Vector_impl_data._M_start + n);
  pdVar2 = (this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __src = pdVar2 + n + 1;
  if (__src != pdVar3) {
    memmove(pdVar2 + n,__src,(long)pdVar3 - (long)__src);
  }
  ppdVar1 = &(this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppdVar1 = *ppdVar1 + -1;
  ppdVar1 = &(this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppdVar1 = *ppdVar1 + -1;
  if ((this->lines).
      super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->lines).
      super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pdVar4 = (this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = (long)(this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar4;
    if (lVar6 != 0) {
      lVar6 = lVar6 >> 3;
      pdVar5 = (this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar7 = 0.0;
      do {
        dVar7 = dVar7 + *pdVar5;
        *pdVar4 = dVar7;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
  }
  return;
}

Assistant:

void ChLinePath::EraseSubLine(size_t n) {
    lines.erase(lines.begin() + n);
    durations.erase(durations.begin() + n);
    end_times.pop_back();
    // force recompute all end times:
    if (lines.size())
        SetSubLineDurationN(0, durations[0]);
}